

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ModelDescription::SerializeWithCachedSizes
          (ModelDescription *this,CodedOutputStream *output)

{
  int iVar1;
  string *psVar2;
  size_type sVar3;
  Type *pTVar4;
  int iVar5;
  
  iVar1 = (this->input_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(this->input_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&pTVar4->super_MessageLite,output);
  }
  iVar1 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(this->output_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::WriteMessage(10,&pTVar4->super_MessageLite,output);
  }
  psVar2 = (this->predictedfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ModelDescription.predictedFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xb,(this->predictedfeaturename_).ptr_,output);
  }
  psVar2 = (this->predictedprobabilitiesname_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ModelDescription.predictedProbabilitiesName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xc,(this->predictedprobabilitiesname_).ptr_,output);
  }
  iVar1 = (this->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(this->traininginput_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::WriteMessage(0x32,&pTVar4->super_MessageLite,output)
    ;
  }
  if (this != (ModelDescription *)&_ModelDescription_default_instance_ &&
      this->metadata_ != (Metadata *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&this->metadata_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void ModelDescription::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ModelDescription)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  for (unsigned int i = 0, n = this->input_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->input(i), output);
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  for (unsigned int i = 0, n = this->output_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->output(i), output);
  }

  // string predictedFeatureName = 11;
  if (this->predictedfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->predictedfeaturename().data(), this->predictedfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ModelDescription.predictedFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->predictedfeaturename(), output);
  }

  // string predictedProbabilitiesName = 12;
  if (this->predictedprobabilitiesname().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->predictedprobabilitiesname().data(), this->predictedprobabilitiesname().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ModelDescription.predictedProbabilitiesName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->predictedprobabilitiesname(), output);
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  for (unsigned int i = 0, n = this->traininginput_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, this->traininginput(i), output);
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->has_metadata()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *this->metadata_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ModelDescription)
}